

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,_kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  Entry *location;
  Entry *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Entry *end_local;
  Entry *start_local;
  Entry *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  for (end_local = start; location = guard.start, end_local != guard.pos;
      end_local = (Entry *)&end_local[1].value.ptr) {
    params = mv<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                       (end_local);
    ctor<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
              (location,params);
    guard.start = (Entry *)&guard.start[1].value.ptr;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }